

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLError __thiscall tinyxml2::XMLElement::QueryDoubleText(XMLElement *this,double *dval)

{
  XMLNode *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  XMLError XVar4;
  
  pXVar1 = (this->super_XMLNode)._firstChild;
  XVar4 = XML_NO_TEXT_NODE;
  if (pXVar1 != (XMLNode *)0x0) {
    iVar2 = (*pXVar1->_vptr_XMLNode[7])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pXVar1 = (this->super_XMLNode)._firstChild;
      iVar2 = (*pXVar1->_vptr_XMLNode[9])(pXVar1);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        pcVar3 = StrPair::GetStr(&pXVar1->_value);
      }
      else {
        pcVar3 = (char *)0x0;
      }
      iVar2 = __isoc99_sscanf(pcVar3,"%lf",dval);
      XVar4 = XML_CAN_NOT_CONVERT_TEXT;
      if (iVar2 == 1) {
        XVar4 = XML_NO_ERROR;
      }
    }
  }
  return XVar4;
}

Assistant:

XMLError XMLElement::QueryDoubleText( double* dval ) const
{
    if ( FirstChild() && FirstChild()->ToText() ) {
        const char* t = FirstChild()->Value();
        if ( XMLUtil::ToDouble( t, dval ) ) {
            return XML_SUCCESS;
        }
        return XML_CAN_NOT_CONVERT_TEXT;
    }
    return XML_NO_TEXT_NODE;
}